

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O2

void Gia_ObjSetXorLevel(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  int iVar2;
  
  iVar1 = Gia_ObjIsXor(pObj);
  if (iVar1 != 0) {
    iVar1 = Gia_ObjLevel(p,pObj + -(*(ulong *)pObj & 0x1fffffff));
    iVar2 = Gia_ObjLevel(p,pObj + -((ulong)*(uint *)&pObj->field_0x4 & 0x1fffffff));
    if (iVar1 <= iVar2) {
      iVar1 = iVar2;
    }
    Gia_ObjSetLevel(p,pObj,iVar1 + 2);
    return;
  }
  __assert_fail("Gia_ObjIsXor(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                ,0x20f,"void Gia_ObjSetXorLevel(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

static inline void         Gia_ObjSetXorLevel( Gia_Man_t * p, Gia_Obj_t * pObj ) { assert( Gia_ObjIsXor(pObj) ); Gia_ObjSetLevel( p, pObj, 2+Abc_MaxInt(Gia_ObjLevel(p,Gia_ObjFanin0(pObj)),Gia_ObjLevel(p,Gia_ObjFanin1(pObj))) ); }